

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_deblk_edge_filter.c
# Opt level: O0

void ihevc_deblk_chroma_horz
               (UWORD8 *pu1_src,WORD32 src_strd,WORD32 quant_param_p,WORD32 quant_param_q,
               WORD32 qp_offset_u,WORD32 qp_offset_v,WORD32 tc_offset_div2,WORD32 filter_flag_p,
               WORD32 filter_flag_q)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  byte *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  WORD32 col;
  WORD32 tmp_q0;
  WORD32 tmp_p0;
  WORD32 delta;
  WORD32 tc;
  WORD32 tc_v;
  WORD32 tc_indx_v;
  WORD32 tc_u;
  WORD32 tc_indx_u;
  WORD32 qp_chroma_v;
  WORD32 qp_indx_v;
  WORD32 qp_chroma_u;
  WORD32 qp_indx_u;
  byte local_8c;
  byte local_88;
  byte local_84;
  byte local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  WORD32 local_60;
  WORD32 local_5c;
  WORD32 local_58;
  WORD32 local_54;
  uint local_50;
  byte *local_8;
  
  if ((in_stack_00000010 == 0) && (in_stack_00000018 == 0)) {
    __assert_fail("(filter_flag_p || filter_flag_q)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/ihevc_deblk_edge_filter.c"
                  ,0x2dc,
                  "void ihevc_deblk_chroma_horz(UWORD8 *, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32)"
                 );
  }
  local_54 = in_R8D + (in_EDX + in_ECX + 1 >> 1);
  if (-1 < local_54) {
    if (local_54 < 0x3a) {
      local_58 = gai4_ihevc_qp_table[local_54];
    }
    else {
      local_58 = local_54 + -6;
    }
    local_54 = local_58;
  }
  local_5c = in_R9D + (in_EDX + in_ECX + 1 >> 1);
  if (-1 < local_5c) {
    if (local_5c < 0x3a) {
      local_60 = gai4_ihevc_qp_table[local_5c];
    }
    else {
      local_60 = local_5c + -6;
    }
    local_5c = local_60;
  }
  if (local_54 + 2 + in_stack_00000008 * 2 < 0x36) {
    if (local_54 + 2 + in_stack_00000008 * 2 < 0) {
      local_68 = 0;
    }
    else {
      local_68 = local_54 + 2 + in_stack_00000008 * 2;
    }
    local_64 = local_68;
  }
  else {
    local_64 = 0x35;
  }
  iVar1 = gai4_ihevc_tc_table[local_64];
  if (local_5c + 2 + in_stack_00000008 * 2 < 0x36) {
    if (local_5c + 2 + in_stack_00000008 * 2 < 0) {
      local_70 = 0;
    }
    else {
      local_70 = local_5c + 2 + in_stack_00000008 * 2;
    }
    local_6c = local_70;
  }
  else {
    local_6c = 0x35;
  }
  iVar2 = gai4_ihevc_tc_table[local_6c];
  if ((iVar1 != 0) || (iVar2 != 0)) {
    local_8 = in_RDI;
    for (local_50 = 0; (int)local_50 < 8; local_50 = local_50 + 1) {
      local_74 = iVar1;
      if ((local_50 & 1) != 0) {
        local_74 = iVar2;
      }
      if (local_74 <
          (int)(((((uint)*local_8 - (uint)local_8[-in_ESI]) * 4 + (uint)local_8[in_ESI * -2]) -
                (uint)local_8[in_ESI]) + 4) >> 3) {
        local_78 = local_74;
      }
      else {
        iVar3 = (int)(((((uint)*local_8 - (uint)local_8[-in_ESI]) * 4 + (uint)local_8[in_ESI * -2])
                      - (uint)local_8[in_ESI]) + 4) >> 3;
        if (SBORROW4(iVar3,-local_74) == iVar3 + local_74 < 0) {
          local_7c = (int)(((((uint)*local_8 - (uint)local_8[-in_ESI]) * 4 +
                            (uint)local_8[in_ESI * -2]) - (uint)local_8[in_ESI]) + 4) >> 3;
        }
        else {
          local_7c = -local_74;
        }
        local_78 = local_7c;
      }
      if ((int)((uint)local_8[-in_ESI] + local_78) < 0x100) {
        if ((int)((uint)local_8[-in_ESI] + local_78) < 0) {
          local_84 = 0;
        }
        else {
          local_84 = local_8[-in_ESI] + (char)local_78;
        }
        local_80 = local_84;
      }
      else {
        local_80 = 0xff;
      }
      if ((int)((uint)*local_8 - local_78) < 0x100) {
        if ((int)((uint)*local_8 - local_78) < 0) {
          local_8c = 0;
        }
        else {
          local_8c = *local_8 - (char)local_78;
        }
        local_88 = local_8c;
      }
      else {
        local_88 = 0xff;
      }
      if (in_stack_00000010 != 0) {
        local_8[-in_ESI] = local_80;
      }
      if (in_stack_00000018 != 0) {
        *local_8 = local_88;
      }
      local_8 = local_8 + 1;
    }
  }
  return;
}

Assistant:

void ihevc_deblk_chroma_horz(UWORD8 *pu1_src,
                             WORD32 src_strd,
                             WORD32 quant_param_p,
                             WORD32 quant_param_q,
                             WORD32 qp_offset_u,
                             WORD32 qp_offset_v,
                             WORD32 tc_offset_div2,
                             WORD32 filter_flag_p,
                             WORD32 filter_flag_q)
{
    WORD32 qp_indx_u, qp_chroma_u;
    WORD32 qp_indx_v, qp_chroma_v;
    WORD32 tc_indx_u, tc_u;
    WORD32 tc_indx_v, tc_v;
    WORD32 tc;

    WORD32 delta, tmp_p0, tmp_q0;
    WORD32 col;

    ASSERT(filter_flag_p || filter_flag_q);

    /* chroma processing is done only if BS is 2             */
    /* this function is assumed to be called only if BS is 2 */
    qp_indx_u = qp_offset_u + ((quant_param_p + quant_param_q + 1) >> 1);
    qp_chroma_u = qp_indx_u < 0 ? qp_indx_u : (qp_indx_u > 57 ? qp_indx_u - 6 : gai4_ihevc_qp_table[qp_indx_u]);

    qp_indx_v = qp_offset_v + ((quant_param_p + quant_param_q + 1) >> 1);
    qp_chroma_v = qp_indx_v < 0 ? qp_indx_v : (qp_indx_v > 57 ? qp_indx_v - 6 : gai4_ihevc_qp_table[qp_indx_v]);

    tc_indx_u = CLIP3(qp_chroma_u + 2 + (tc_offset_div2 << 1), 0, 53);
    tc_u = gai4_ihevc_tc_table[tc_indx_u];

    tc_indx_v = CLIP3(qp_chroma_v + 2 + (tc_offset_div2 << 1), 0, 53);
    tc_v = gai4_ihevc_tc_table[tc_indx_v];

    if(0 == tc_u && 0 == tc_v)
    {
        return;
    }

    for(col = 0; col < 8; col++)
    {
        tc = (col & 1) ? tc_v : tc_u;
        delta = CLIP3((((pu1_src[0 * src_strd] -
                      pu1_src[-1 * src_strd]) << 2) +
                      pu1_src[-2 * src_strd] -
                      pu1_src[1 * src_strd] + 4) >> 3,
                      -tc, tc);

        tmp_p0 = CLIP_U8(pu1_src[-1 * src_strd] + delta);
        tmp_q0 = CLIP_U8(pu1_src[0 * src_strd] - delta);

        if(filter_flag_p != 0)
        {
            pu1_src[-1 * src_strd] = tmp_p0;
        }

        if(filter_flag_q != 0)
        {
            pu1_src[0 * src_strd] = tmp_q0;
        }

        pu1_src += 1;
    }

}